

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_ecmult_context *ctx,secp256k1_strauss_state *state,secp256k1_gej *r,
               size_t num,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  int iVar1;
  undefined1 local_5b8 [4];
  int n;
  secp256k1_gej tmp;
  size_t no;
  size_t np;
  int local_520;
  int bits;
  int i;
  int bits_ng_128;
  int wnaf_ng_128 [129];
  int local_30c;
  int local_308;
  int bits_ng_1;
  int wnaf_ng_1 [129];
  undefined1 local_f8 [8];
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  secp256k1_fe Z;
  secp256k1_ge tmpa;
  secp256k1_scalar *na_local;
  secp256k1_gej *a_local;
  size_t num_local;
  secp256k1_gej *r_local;
  secp256k1_strauss_state *state_local;
  secp256k1_ecmult_context *ctx_local;
  
  local_30c = 0;
  bits = 0;
  np._4_4_ = 0;
  tmp.infinity = 0;
  tmp._124_4_ = 0;
  tmpa._80_8_ = na;
  for (no = 0; no < num; no = no + 1) {
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)(tmpa._80_8_ + no * 0x20));
    if ((iVar1 == 0) && (iVar1 = secp256k1_gej_is_infinity(a + no), iVar1 == 0)) {
      state->ps[tmp._120_8_].input_pos = no;
      secp256k1_scalar_split_lambda
                (&state->ps[tmp._120_8_].na_1,&state->ps[tmp._120_8_].na_lam,
                 (secp256k1_scalar *)(tmpa._80_8_ + no * 0x20));
      iVar1 = secp256k1_ecmult_wnaf
                        (state->ps[tmp._120_8_].wnaf_na_1,0x81,&state->ps[tmp._120_8_].na_1,5);
      state->ps[tmp._120_8_].bits_na_1 = iVar1;
      iVar1 = secp256k1_ecmult_wnaf
                        (state->ps[tmp._120_8_].wnaf_na_lam,0x81,&state->ps[tmp._120_8_].na_lam,5);
      state->ps[tmp._120_8_].bits_na_lam = iVar1;
      if (np._4_4_ < state->ps[tmp._120_8_].bits_na_1) {
        np._4_4_ = state->ps[tmp._120_8_].bits_na_1;
      }
      if (np._4_4_ < state->ps[tmp._120_8_].bits_na_lam) {
        np._4_4_ = state->ps[tmp._120_8_].bits_na_lam;
      }
      tmp._120_8_ = tmp._120_8_ + 1;
    }
  }
  if (tmp._120_8_ == 0) {
    secp256k1_fe_set_int((secp256k1_fe *)(ng_1.d + 3),1);
  }
  else {
    secp256k1_ecmult_odd_multiples_table(8,state->prej,state->zr,a + state->ps->input_pos);
    for (no = 1; no < (ulong)tmp._120_8_; no = no + 1) {
      memcpy(local_5b8,a + state->ps[no].input_pos,0x80);
      secp256k1_gej_rescale((secp256k1_gej *)local_5b8,&state->prej[(no - 1) * 8 + 7].z);
      secp256k1_ecmult_odd_multiples_table
                (8,state->prej + no * 8,state->zr + no * 8,(secp256k1_gej *)local_5b8);
      secp256k1_fe_mul(state->zr + no * 8,state->zr + no * 8,&a[state->ps[no].input_pos].z);
    }
    secp256k1_ge_globalz_set_table_gej
              (tmp._120_8_ << 3,state->pre_a,(secp256k1_fe *)(ng_1.d + 3),state->prej,state->zr);
  }
  for (no = 0; no < (ulong)tmp._120_8_; no = no + 1) {
    for (local_520 = 0; local_520 < 8; local_520 = local_520 + 1) {
      secp256k1_ge_mul_lambda
                (state->pre_a_lam + no * 8 + (long)local_520,state->pre_a + no * 8 + (long)local_520
                );
    }
  }
  if (ng != (secp256k1_scalar *)0x0) {
    secp256k1_scalar_split_128((secp256k1_scalar *)(ng_128.d + 3),(secp256k1_scalar *)local_f8,ng);
    local_30c = secp256k1_ecmult_wnaf(&local_308,0x81,(secp256k1_scalar *)(ng_128.d + 3),0xf);
    bits = secp256k1_ecmult_wnaf(&i,0x81,(secp256k1_scalar *)local_f8,0xf);
    if (np._4_4_ < local_30c) {
      np._4_4_ = local_30c;
    }
    if (np._4_4_ < bits) {
      np._4_4_ = bits;
    }
  }
  secp256k1_gej_set_infinity(r);
  while (local_520 = np._4_4_ + -1, -1 < local_520) {
    secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
    for (no = 0; no < (ulong)tmp._120_8_; no = no + 1) {
      if ((local_520 < state->ps[no].bits_na_1) &&
         (iVar1 = state->ps[no].wnaf_na_1[local_520], iVar1 != 0)) {
        if (iVar1 < 1) {
          memcpy(Z.n + 4,state->pre_a + no * 8 + (long)((-1 - iVar1) / 2),0x58);
          secp256k1_fe_negate((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)(tmpa.x.n + 4),1);
        }
        else {
          memcpy(Z.n + 4,state->pre_a + no * 8 + (long)((iVar1 + -1) / 2),0x58);
        }
        secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)(Z.n + 4),(secp256k1_fe *)0x0);
      }
      if ((local_520 < state->ps[no].bits_na_lam) &&
         (iVar1 = state->ps[no].wnaf_na_lam[local_520], iVar1 != 0)) {
        if (iVar1 < 1) {
          memcpy(Z.n + 4,state->pre_a_lam + no * 8 + (long)((-1 - iVar1) / 2),0x58);
          secp256k1_fe_negate((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)(tmpa.x.n + 4),1);
        }
        else {
          memcpy(Z.n + 4,state->pre_a_lam + no * 8 + (long)((iVar1 + -1) / 2),0x58);
        }
        secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)(Z.n + 4),(secp256k1_fe *)0x0);
      }
    }
    if ((local_520 < local_30c) && (iVar1 = (&local_308)[local_520], iVar1 != 0)) {
      if (iVar1 < 1) {
        secp256k1_ge_from_storage
                  ((secp256k1_ge *)(Z.n + 4),
                   (secp256k1_ge_storage *)(ctx->pre_g + (long)((-1 - iVar1) / 2) * 0x40));
        secp256k1_fe_negate((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)(tmpa.x.n + 4),1);
      }
      else {
        secp256k1_ge_from_storage
                  ((secp256k1_ge *)(Z.n + 4),
                   (secp256k1_ge_storage *)(ctx->pre_g + (long)((iVar1 + -1) / 2) * 0x40));
      }
      secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)(Z.n + 4),(secp256k1_fe *)(ng_1.d + 3));
    }
    np._4_4_ = local_520;
    if ((local_520 < bits) && (iVar1 = (&i)[local_520], iVar1 != 0)) {
      if (iVar1 < 1) {
        secp256k1_ge_from_storage
                  ((secp256k1_ge *)(Z.n + 4),
                   (secp256k1_ge_storage *)(ctx->pre_g_128 + (long)((-1 - iVar1) / 2) * 0x40));
        secp256k1_fe_negate((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)(tmpa.x.n + 4),1);
      }
      else {
        secp256k1_ge_from_storage
                  ((secp256k1_ge *)(Z.n + 4),
                   (secp256k1_ge_storage *)(ctx->pre_g_128 + (long)((iVar1 + -1) / 2) * 0x40));
      }
      secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)(Z.n + 4),(secp256k1_fe *)(ng_1.d + 3));
    }
  }
  if (r->infinity == 0) {
    secp256k1_fe_mul(&r->z,&r->z,(secp256k1_fe *)(ng_1.d + 3));
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const secp256k1_ecmult_context *ctx, const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Splitted G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    for (np = 0; np < num; ++np) {
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        state->ps[no].input_pos = np;
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&state->ps[no].na_1, &state->ps[no].na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &state->ps[no].na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &state->ps[no].na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }
        ++no;
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     * The exception is the precomputed G table points, which are actually
     * affine. Compared to the base used for other points, they have a Z ratio
     * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
     * isomorphism to efficiently add with a known Z inverse.
     */
    if (no > 0) {
        /* Compute the odd multiples in Jacobian form. */
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->prej, state->zr, &a[state->ps[0].input_pos]);
        for (np = 1; np < no; ++np) {
            secp256k1_gej tmp = a[state->ps[np].input_pos];
#ifdef VERIFY
            secp256k1_fe_normalize_var(&(state->prej[(np - 1) * ECMULT_TABLE_SIZE(WINDOW_A) + ECMULT_TABLE_SIZE(WINDOW_A) - 1].z));
#endif
            secp256k1_gej_rescale(&tmp, &(state->prej[(np - 1) * ECMULT_TABLE_SIZE(WINDOW_A) + ECMULT_TABLE_SIZE(WINDOW_A) - 1].z));
            secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->prej + np * ECMULT_TABLE_SIZE(WINDOW_A), state->zr + np * ECMULT_TABLE_SIZE(WINDOW_A), &tmp);
            secp256k1_fe_mul(state->zr + np * ECMULT_TABLE_SIZE(WINDOW_A), state->zr + np * ECMULT_TABLE_SIZE(WINDOW_A), &(a[state->ps[np].input_pos].z));
        }
        /* Bring them to the same Z denominator. */
        secp256k1_ge_globalz_set_table_gej(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, &Z, state->prej, state->zr);
    } else {
        secp256k1_fe_set_int(&Z, 1);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&state->pre_a_lam[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i]);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                ECMULT_TABLE_GET_GE(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                ECMULT_TABLE_GET_GE(&tmpa, state->pre_a_lam + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            ECMULT_TABLE_GET_GE_STORAGE(&tmpa, *ctx->pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            ECMULT_TABLE_GET_GE_STORAGE(&tmpa, *ctx->pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}